

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O0

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::finish
          (Fasttrack<std::shared_mutex> *this,tls_t tls,tid_t thread_id)

{
  lock_guard<std::shared_mutex> local_28;
  lock_guard<std::shared_mutex> exLockT;
  tid_t thread_id_local;
  tls_t tls_local;
  Fasttrack<std::shared_mutex> *this_local;
  
  exLockT._M_device = (mutex_type *)thread_id;
  std::lock_guard<std::shared_mutex>::lock_guard(&local_28,&this->g_lock);
  phmap::container_internal::
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  ::erase<unsigned_long>
            ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
              *)&this->threads,(key_arg<unsigned_long> *)&exLockT);
  cleanup(this,(EVP_PKEY_CTX *)((ulong)exLockT._M_device & 0xffffffff));
  std::lock_guard<std::shared_mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void finish(tls_t tls, tid_t thread_id) final {
    std::lock_guard<LockT> exLockT(g_lock);
    /// just delete thread from list, no backward sync needed
    threads.erase(thread_id);
    cleanup(thread_id);
  }